

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

void SDL_QuitSubSystem(Uint32 sdl12flags)

{
  SDL_bool SVar1;
  Uint32 UVar2;
  uint local_14;
  Uint32 local_10;
  Uint32 extraflags;
  Uint32 sdl20flags;
  Uint32 sdl12flags_local;
  
  extraflags = sdl12flags;
  SVar1 = SDL12Compat_GetHintBoolean("SDL12COMPAT_NO_QUIT_VIDEO",SDL_FALSE);
  if (SVar1 != SDL_FALSE) {
    extraflags = extraflags & 0xffffffdf;
  }
  InitFlags12to20(extraflags,&local_10,&local_14);
  if ((local_14 & 0x100) != 0) {
    QuitCDSubsystem();
  }
  if ((extraflags & 0x10) != 0) {
    SDL_CloseAudio();
  }
  if ((extraflags & 0x20) != 0) {
    Quit12Video();
  }
  if ((extraflags & 0x200) != 0) {
    Quit12Joystick();
  }
  (*SDL20_QuitSubSystem)(local_10);
  UVar2 = (*SDL20_WasInit)(0);
  if ((UVar2 == 0) && (CDRomInit == SDL_FALSE)) {
    (*SDL20_Quit)();
  }
  InitializedSubsystems20 = (local_10 ^ 0xffffffff) & InitializedSubsystems20 & 0xffefffff;
  return;
}

Assistant:

SDLCALL
SDL_QuitSubSystem(Uint32 sdl12flags)
{
    Uint32 sdl20flags, extraflags;

    /* Some games (notably the Steam build of Multiwinia), will
     * SDL_Quit(SDL_INIT_VIDEO) on resolution change, and never call
     * SDL_Init() again before creating their new window.
     */
    if (SDL12Compat_GetHintBoolean("SDL12COMPAT_NO_QUIT_VIDEO", SDL_FALSE)) {
        sdl12flags &= ~SDL12_INIT_VIDEO;
    }
    InitFlags12to20(sdl12flags, &sdl20flags, &extraflags);

    if (extraflags & SDL12_INIT_CDROM) {
        QuitCDSubsystem();
    }

    if (sdl12flags & SDL12_INIT_AUDIO) {
        SDL_CloseAudio();
    }

    if (sdl12flags & SDL12_INIT_VIDEO) {
        Quit12Video();
    }

    if (sdl12flags & SDL12_INIT_JOYSTICK) {
        Quit12Joystick();
    }

    SDL20_QuitSubSystem(sdl20flags);

    if ((SDL20_WasInit(0) == 0) && (!CDRomInit)) {
        SDL20_Quit();
    }

    InitializedSubsystems20 &= ~sdl20flags;
    InitializedSubsystems20 &= ~SDL_INIT_NOPARACHUTE;  /* SDL2 accepts this flag but ignores it. */
}